

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O3

void __thiscall
cmLocalUnixMakefileGenerator3::AppendCustomDepends
          (cmLocalUnixMakefileGenerator3 *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *depends,vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *ccs)

{
  pointer pcVar1;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  computeInternalDepfile;
  pointer cc;
  cmCustomCommandGenerator ccg;
  undefined8 in_stack_fffffffffffffdf0;
  undefined8 in_stack_fffffffffffffdf8;
  undefined8 in_stack_fffffffffffffe00;
  undefined1 local_1f8 [16];
  bool local_1e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_1e0;
  string local_1d8;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  code *local_1a8;
  undefined8 uStack_1a0;
  cmCustomCommandGenerator local_190;
  
  cc = (ccs->super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>)._M_impl.
       super__Vector_impl_data._M_start;
  pcVar1 = (ccs->super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (cc != pcVar1) {
    local_1e0 = depends;
    do {
      GetConfigName_abi_cxx11_(&local_1d8,this);
      local_1e8 = false;
      local_1b8 = 0;
      uStack_1b0 = 0;
      local_1a8 = (code *)0x0;
      uStack_1a0 = 0;
      computeInternalDepfile.super__Function_base._M_functor._8_8_ = in_stack_fffffffffffffdf0;
      computeInternalDepfile.super__Function_base._M_functor._M_unused._M_object = &local_1b8;
      computeInternalDepfile.super__Function_base._M_manager =
           (_Manager_type)in_stack_fffffffffffffdf8;
      computeInternalDepfile._M_invoker = (_Invoker_type)in_stack_fffffffffffffe00;
      cmCustomCommandGenerator::cmCustomCommandGenerator
                (&local_190,cc,&local_1d8,(cmLocalGenerator *)this,true,
                 (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xfffffffffffffdf8,computeInternalDepfile);
      if (local_1a8 != (code *)0x0) {
        (*local_1a8)(&local_1b8,&local_1b8,3);
      }
      if (local_1e8 == true) {
        local_1e8 = false;
        if ((undefined1 *)in_stack_fffffffffffffdf8 != local_1f8) {
          operator_delete((void *)in_stack_fffffffffffffdf8,local_1f8._0_8_ + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
      }
      AppendCustomDepend(this,local_1e0,&local_190);
      cmCustomCommandGenerator::~cmCustomCommandGenerator(&local_190);
      cc = cc + 1;
    } while (cc != pcVar1);
  }
  return;
}

Assistant:

void cmLocalUnixMakefileGenerator3::AppendCustomDepends(
  std::vector<std::string>& depends, const std::vector<cmCustomCommand>& ccs)
{
  for (cmCustomCommand const& cc : ccs) {
    cmCustomCommandGenerator ccg(cc, this->GetConfigName(), this);
    this->AppendCustomDepend(depends, ccg);
  }
}